

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Sol * earliestStart(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs
                   ,long STEPS,long THRESHOLD,long rows,long cols)

{
  vector<ride,std::allocator<ride>> *this;
  iterator iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  pointer prVar8;
  ride *prVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  vector<ride,_std::allocator<ride>_> idxset;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  vector<bool,_std::allocator<bool>_> used;
  value_type local_c8;
  ride *local_a8;
  iterator iStack_a0;
  ride *local_98;
  Sol *local_90;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> local_88;
  vector<bool,_std::allocator<bool>_> local_68;
  long local_40;
  long local_38;
  
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_40 = THRESHOLD;
  local_38 = STEPS;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_68,
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6,(bool *)&local_88,
             (allocator_type *)&local_c8);
  local_90 = __return_storage_ptr__;
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&local_88);
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < vehs) {
    lVar14 = 0;
    do {
      local_c8.avail_time = 0;
      local_c8.loc.x = 0;
      local_c8.loc.y = 0;
      local_c8.id = lVar14;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&local_88,&local_c8);
      lVar14 = lVar14 + 1;
    } while (vehs != lVar14);
  }
  if ((rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar10 = 0;
    do {
      local_c8.id = (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                     super__Vector_impl_data._M_start)->id;
      local_c8.avail_time =
           (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->avail_time;
      local_c8.loc.x =
           ((local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).x;
      local_c8.loc.y =
           ((local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
             super__Vector_impl_data._M_start)->loc).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
                (&local_88);
      iVar11 = 5;
      if (local_c8.avail_time < local_38) {
        prVar8 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0x7fffffffffffffff;
        lVar7 = (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)prVar8;
        if (lVar7 != 0) {
          lVar7 = lVar7 >> 6;
          plVar5 = &(prVar8->start).y;
          uVar13 = 0;
          do {
            if (((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
                  (uVar13 & 0x3f) & 1) == 0) && (local_c8.avail_time <= plVar5[-3])) {
              lVar15 = local_c8.loc.x - ((pt *)(plVar5 + -1))->x;
              lVar6 = -lVar15;
              if (0 < lVar15) {
                lVar6 = lVar15;
              }
              lVar16 = local_c8.loc.y - *plVar5;
              lVar15 = -lVar16;
              if (0 < lVar16) {
                lVar15 = lVar16;
              }
              lVar15 = lVar6 + local_c8.avail_time + lVar15;
              if (lVar15 <= plVar5[-4]) {
                lVar15 = plVar5[-4];
              }
              if ((lVar15 < lVar14) && (plVar5[-2] + lVar15 <= plVar5[-3])) {
                lVar14 = lVar15;
              }
            }
            uVar13 = uVar13 + 1;
            plVar5 = plVar5 + 8;
          } while (lVar7 + (ulong)(lVar7 == 0) != uVar13);
        }
        local_a8 = (ride *)0x0;
        iStack_a0._M_current = (ride *)0x0;
        local_98 = (ride *)0x0;
        prVar8 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.super__Vector_impl_data
            ._M_finish != prVar8) {
          lVar14 = lVar14 + local_40;
          lVar7 = 0;
          uVar13 = 0;
          do {
            if ((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
                 (uVar13 & 0x3f) & 1) == 0) {
              lVar6 = *(long *)((long)&prVar8->e_time + lVar7);
              if (local_c8.avail_time <= lVar6) {
                lVar16 = local_c8.loc.x - *(long *)((long)&(prVar8->start).x + lVar7);
                lVar15 = -lVar16;
                if (0 < lVar16) {
                  lVar15 = lVar16;
                }
                lVar12 = local_c8.loc.y - *(long *)((long)&(prVar8->start).y + lVar7);
                lVar16 = -lVar12;
                if (0 < lVar12) {
                  lVar16 = lVar12;
                }
                lVar16 = lVar15 + local_c8.avail_time + lVar16;
                lVar15 = *(long *)((long)&prVar8->s_time + lVar7);
                if (lVar16 <= lVar15) {
                  lVar16 = lVar15;
                }
                if ((lVar16 < lVar14) && (lVar16 + *(long *)((long)&prVar8->len + lVar7) <= lVar6))
                {
                  prVar9 = (ride *)((long)&prVar8->id + lVar7);
                  if (iStack_a0._M_current == local_98) {
                    std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                              ((vector<ride,std::allocator<ride>> *)&local_a8,iStack_a0,prVar9);
                  }
                  else {
                    lVar6 = prVar9->id;
                    lVar15 = prVar9->s_time;
                    lVar16 = prVar9->e_time;
                    lVar12 = prVar9->len;
                    lVar2 = (prVar9->start).x;
                    lVar3 = (prVar9->start).y;
                    lVar4 = (prVar9->end).y;
                    ((iStack_a0._M_current)->end).x = (prVar9->end).x;
                    ((iStack_a0._M_current)->end).y = lVar4;
                    ((iStack_a0._M_current)->start).x = lVar2;
                    ((iStack_a0._M_current)->start).y = lVar3;
                    (iStack_a0._M_current)->e_time = lVar16;
                    (iStack_a0._M_current)->len = lVar12;
                    (iStack_a0._M_current)->id = lVar6;
                    (iStack_a0._M_current)->s_time = lVar15;
                    iStack_a0._M_current = iStack_a0._M_current + 1;
                  }
                }
              }
            }
            uVar13 = uVar13 + 1;
            prVar8 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = lVar7 + 0x40;
          } while (uVar13 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>).
                                          _M_impl.super__Vector_impl_data._M_finish - (long)prVar8
                                   >> 6));
        }
        iVar1._M_current = iStack_a0._M_current;
        prVar9 = local_a8;
        if (local_a8 == iStack_a0._M_current) {
          iVar11 = 7;
        }
        else {
          uVar13 = (long)iStack_a0._M_current - (long)local_a8 >> 6;
          lVar14 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<lensort>>
                    (local_a8,iStack_a0._M_current,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<ride*,std::vector<ride,std::allocator<ride>>>,__gnu_cxx::__ops::_Iter_comp_iter<lensort>>
                    (prVar9,iVar1._M_current);
          uVar13 = local_a8->id;
          if (((long)uVar13 < 0) ||
             (prVar8 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                       super__Vector_impl_data._M_start,
             (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)prVar8 >> 6) <= uVar13)) {
            __assert_fail("min_idx >= 0 && min_idx < rides.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                          ,0xc3,
                          "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                         );
          }
          prVar9 = prVar8 + uVar13;
          this = (vector<ride,std::allocator<ride>> *)
                 ((local_90->
                  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_c8.id);
          iVar1._M_current = *(ride **)(this + 8);
          if (iVar1._M_current == *(ride **)(this + 0x10)) {
            std::vector<ride,std::allocator<ride>>::_M_realloc_insert<ride_const&>
                      (this,iVar1,prVar9);
          }
          else {
            lVar14 = prVar9->id;
            lVar7 = prVar9->s_time;
            lVar6 = prVar9->e_time;
            lVar15 = prVar9->len;
            lVar16 = (prVar9->start).x;
            lVar12 = (prVar9->start).y;
            lVar2 = (prVar9->end).y;
            ((iVar1._M_current)->end).x = (prVar9->end).x;
            ((iVar1._M_current)->end).y = lVar2;
            ((iVar1._M_current)->start).x = lVar16;
            ((iVar1._M_current)->start).y = lVar12;
            (iVar1._M_current)->e_time = lVar6;
            (iVar1._M_current)->len = lVar15;
            (iVar1._M_current)->id = lVar14;
            (iVar1._M_current)->s_time = lVar7;
            *(long *)(this + 8) = *(long *)(this + 8) + 0x40;
          }
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] =
               local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] | 1L << ((byte)uVar13 & 0x3f);
          lVar7 = local_c8.loc.x - (prVar9->start).x;
          lVar14 = -lVar7;
          if (0 < lVar7) {
            lVar14 = lVar7;
          }
          lVar6 = local_c8.loc.y - (prVar9->start).y;
          lVar7 = -lVar6;
          if (0 < lVar6) {
            lVar7 = lVar6;
          }
          lVar7 = lVar14 + local_c8.avail_time + lVar7;
          if (lVar7 <= prVar9->s_time) {
            lVar7 = prVar9->s_time;
          }
          local_c8.avail_time = lVar7 + prVar9->len;
          if (prVar9->e_time < local_c8.avail_time) {
            __assert_fail("v.avail_time <= chosen.e_time",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                          ,0xce,
                          "Sol earliestStart(const vector<ride> &, const long, const long, const long, const long, const long)"
                         );
          }
          local_c8.loc.x = (prVar9->end).x;
          local_c8.loc.y = (prVar9->end).y;
          iVar11 = 0;
          std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                    (&local_88,&local_c8);
        }
        if (local_a8 != (ride *)0x0) {
          operator_delete(local_a8,(long)local_98 - (long)local_a8);
        }
      }
    } while (((iVar11 == 7) || (iVar11 == 0)) &&
            (uVar10 = uVar10 + 1,
            uVar10 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 6)));
  }
  if (local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_90;
}

Assistant:

Sol earliestStart(const vector<ride>& rides, const long vehs, const long STEPS, const long THRESHOLD, const long rows, const long cols) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_start_time = LONG_MAX;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (start_time < min_start_time && end_time <= r.e_time) {
                min_start_time = start_time;
            }
        }

        vector<ride> idxset;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long start_time = max(v.avail_time + closeness, r.s_time);
            const long end_time = start_time + r.len; // max(no-wait, wait)
            if (min_start_time + THRESHOLD > start_time && end_time <= r.e_time) {
                idxset.push_back(r);
            }
        }

        // rand num between 0 and idxset.size()
        if (idxset.empty()) continue; // leave out this car
//        if (idxset.size() > 2) cerr << "IDXSET size: " << idxset.size() << endl;

        sort(idxset.begin(), idxset.end(), lensort());
        long min_idx = idxset[0].id;
        assert(min_idx >= 0 && min_idx < rides.size());

        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        long closeness = dist(v.loc, chosen.start);
        long start_time = max(v.avail_time + closeness, chosen.s_time);
        v.avail_time = start_time + chosen.len;
        assert(v.avail_time <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}